

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq,ldf *data)

{
  uint64_t *puVar1;
  float fVar2;
  int iVar3;
  wclass *pwVar4;
  pointer ppeVar5;
  int *piVar6;
  _func_void_int_string_v_array<char> *p_Var7;
  v_array<char> vVar8;
  bool bVar9;
  char cVar10;
  polyprediction *ppVar11;
  long lVar12;
  ostream *poVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t *puVar17;
  float *pfVar18;
  ulong uVar19;
  int *piVar20;
  long lVar21;
  float fVar22;
  double dVar23;
  string outputString;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffdd8;
  char in_stack_fffffffffffffddf;
  undefined4 in_stack_fffffffffffffde8;
  uint32_t prediction;
  wclass *pwVar24;
  size_t sVar25;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar4 = (ec->l).cs.costs._begin;
  pwVar24 = (ec->l).cs.costs._end;
  if (((((ec->tag)._end != (ec->tag)._begin) ||
       ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin)) &&
      (bVar9 = COST_SENSITIVE::ec_is_example_header(ec), !bVar9)) &&
     (bVar9 = ec_is_label_definition(ec), !bVar9)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + ec->num_features;
    if (data->is_probabilities == true) {
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar19 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppeVar5 >> 3;
      bVar9 = COST_SENSITIVE::ec_is_example_header(*ppeVar5);
      uVar15 = (ulong)bVar9;
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = uVar15;
      if (uVar15 < uVar19) {
        fVar22 = 3.4028235e+38;
        do {
          fVar2 = ppeVar5[uVar15]->partial_prediction;
          if (fVar2 < fVar22) {
            uVar16 = uVar15 & 0xffffffff;
            fVar22 = fVar2;
          }
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
      }
      ppVar11 = (polyprediction *)&((ppeVar5[uVar16]->l).cs.costs._begin)->class_index;
    }
    else {
      ppVar11 = &ec->pred;
    }
    prediction = ppVar11->multiclass;
    cVar10 = (*(code *)PTR_test_label_002d1a50)(&ec->l);
    if (cVar10 == '\0') {
      if ((long)pwVar24 - (long)pwVar4 == 0) {
        dVar23 = 0.0;
      }
      else {
        bVar14 = *hit_loss;
        lVar12 = (long)pwVar24 - (long)pwVar4 >> 4;
        lVar12 = lVar12 + (ulong)(lVar12 == 0);
        puVar17 = &pwVar4->class_index;
        fVar22 = 0.0;
        do {
          if ((bVar14 & 1) != 0) break;
          if (prediction == *puVar17) {
            fVar22 = ((wclass *)(puVar17 + -1))->x;
            *hit_loss = true;
            bVar14 = 1;
          }
          puVar17 = puVar17 + 4;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        dVar23 = (double)fVar22;
      }
      all->sd->sum_loss = all->sd->sum_loss + dVar23;
      all->sd->sum_loss_since_last_dump = dVar23 + all->sd->sum_loss_since_last_dump;
    }
    piVar6 = (all->final_prediction_sink)._end;
    for (piVar20 = (all->final_prediction_sink)._begin; piVar20 != piVar6; piVar20 = piVar20 + 1) {
      fVar22 = (ec->pred).scalar;
      if (data->is_probabilities == false) {
        fVar22 = (float)(uint)fVar22;
      }
      (*all->print)(*piVar20,fVar22,0.0,ec->tag);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      sVar25 = (long)pwVar24 - (long)pwVar4;
      if (sVar25 != 0) {
        lVar12 = (long)sVar25 >> 4;
        pfVar18 = &pwVar4->partial_prediction;
        lVar21 = 0;
        do {
          if (lVar21 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffddf,1);
          }
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffddf = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,&stack0xfffffffffffffddf,1);
          std::ostream::_M_insert<double>((double)*pfVar18);
          lVar21 = lVar21 + 1;
          pfVar18 = pfVar18 + 4;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar21);
      }
      p_Var7 = all->print_text;
      iVar3 = all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar8._begin._7_1_ = in_stack_fffffffffffffddf;
      vVar8._begin._0_7_ = in_stack_fffffffffffffdd8;
      vVar8._end = (char *)all;
      vVar8.end_array._0_4_ = in_stack_fffffffffffffde8;
      vVar8.end_array._4_4_ = prediction;
      vVar8.erase_count = sVar25;
      (*p_Var7)(iVar3,(string)ec->tag,vVar8);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    bVar9 = (bool)(*(code *)PTR_test_label_002d1a50)(&ec->l);
    COST_SENSITIVE::print_update(all,bVar9,ec,ec_seq,false,prediction);
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq, ldf& data)
{
  label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec))
    return;
  if (ec_is_example_header(ec))
    return;
  if (ec_is_label_definition(ec))
    return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class;
  if (data.is_probabilities)
  {
    // predicted_K was already computed in do_actual_learning(),
    // but we cannot store it in ec.pred union because we store ec.pred.prob there.
    // So we must compute it again.
    size_t start_K = 0;
    size_t K = ec_seq->size();
    if (ec_is_example_header(*(*ec_seq)[0]))
      start_K = 1;
    uint32_t predicted_K = (uint32_t)start_K;
    float min_score = FLT_MAX;
    for (size_t k = start_K; k < K; k++)
    {
      example* ec_k = (*ec_seq)[k];
      if (ec_k->partial_prediction < min_score)
      {
        min_score = ec_k->partial_prediction;
        predicted_K = (uint32_t)k;
      }
    }
    predicted_class = (*ec_seq)[predicted_K]->l.cs.costs[0].class_index;
  }
  else
    predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j = 0; j < costs.size(); j++)
    {
      if (hit_loss)
        break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, data.is_probabilities ? ec.pred.prob : (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}